

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcFurnitureType::~IfcFurnitureType(IfcFurnitureType *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)this = 0x976f50;
  *(undefined8 *)&this->field_0x1c0 = 0x977068;
  *(undefined8 *)&this->field_0x88 = 0x976f78;
  *(undefined8 *)&this->field_0x98 = 0x976fa0;
  *(undefined8 *)&this->field_0xf0 = 0x976fc8;
  *(undefined8 *)&this->field_0x148 = 0x976ff0;
  *(undefined8 *)&this->field_0x180 = 0x977018;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFurnitureType,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x977040;
  puVar1 = *(undefined1 **)
            &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFurnitureType,_1UL>).field_0x10;
  if (puVar1 != &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFurnitureType,_1UL>).
                 field_0x20) {
    operator_delete(puVar1);
  }
  *(undefined8 *)this = 0x977330;
  *(undefined8 *)&this->field_0x1c0 = 0x9773f8;
  *(undefined8 *)&this->field_0x88 = 0x977358;
  *(undefined8 *)&this->field_0x98 = 0x977380;
  *(undefined8 *)&this->field_0xf0 = 0x9773a8;
  *(undefined8 *)&this->field_0x148 = 0x9773d0;
  if (*(undefined1 **)&this->field_0x158 != &this->field_0x168) {
    operator_delete(*(undefined1 **)&this->field_0x158);
  }
  IfcTypeProduct::~IfcTypeProduct((IfcTypeProduct *)this,&PTR_construction_vtable_24__00977090);
  operator_delete(this);
  return;
}

Assistant:

IfcFurnitureType() : Object("IfcFurnitureType") {}